

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<tinyusdz::value::half,4ul>>
          (Attribute *this,array<tinyusdz::value::half,_4UL> *v)

{
  value_type *pvVar1;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_34;
  undefined1 local_2a [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> ret;
  array<tinyusdz::value::half,_4UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<tinyusdz::value::half,_4UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained = (storage_t<std::array<tinyusdz::value::half,_4UL>_>)v;
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>(&local_34,&this->_var);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
    optional<std::array<tinyusdz::value::half,_4UL>,_0>
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_2a,&local_34);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional(&local_34);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2a);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                         ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_2a);
      *(undefined8 *)ret.contained = *(undefined8 *)pvVar1->_M_elems;
    }
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_2a);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }